

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall
minja::FilterNode::FilterNode
          (FilterNode *this,Location *loc,shared_ptr<minja::Expression> *f,
          shared_ptr<minja::TemplateNode> *b)

{
  TemplateNode *in_RCX;
  Location *in_RDI;
  
  TemplateNode::TemplateNode(in_RCX,in_RDI);
  (in_RDI->source).
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)&PTR_do_render_00480880;
  std::shared_ptr<minja::Expression>::shared_ptr
            ((shared_ptr<minja::Expression> *)in_RCX,(shared_ptr<minja::Expression> *)in_RDI);
  std::shared_ptr<minja::TemplateNode>::shared_ptr
            ((shared_ptr<minja::TemplateNode> *)in_RCX,(shared_ptr<minja::TemplateNode> *)in_RDI);
  return;
}

Assistant:

FilterNode(const Location & loc, std::shared_ptr<Expression> && f, std::shared_ptr<TemplateNode> && b)
        : TemplateNode(loc), filter(std::move(f)), body(std::move(b)) {}